

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

shared_ptr<BreakPoint> __thiscall Debugger::FindBreakPoint(Debugger *this,lua_Debug *ar)

{
  lua_State *plVar1;
  int iVar2;
  iterator iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<BreakPoint> sVar4;
  int cl;
  string chunkname;
  set<int,_std::less<int>,_std::allocator<int>_> lineSet;
  int local_7c;
  string local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_58;
  
  plVar1 = (lua_State *)(ar->u).ar51.namewhat;
  if (plVar1 == (lua_State *)0x0) {
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_001555c7;
  }
  iVar2 = getDebugCurrentLine((lua_Debug *)in_RDX._M_pi);
  local_7c = iVar2;
  EmmyDebuggerManager::GetLineSet
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_58,
             (EmmyDebuggerManager *)(ar->u).ar51.source);
  if (iVar2 < 0) {
LAB_001555af:
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_enable_shared_from_this<Debugger>)._M_weak_this.
    super___weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_58,&local_7c);
    if ((_Rb_tree_header *)iVar3._M_node == &local_58._M_impl.super__Rb_tree_header)
    goto LAB_001555af;
    (*lua_getinfo)(plVar1,"S",(lua_Debug *)in_RDX._M_pi);
    GetFile_abi_cxx11_(&local_78,(Debugger *)ar,(lua_Debug *)in_RDX._M_pi);
    FindBreakPoint(this,(string *)ar,(int)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_58);
  in_RDX._M_pi = extraout_RDX;
LAB_001555c7:
  sVar4.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BreakPoint>)sVar4.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BreakPoint> Debugger::FindBreakPoint(lua_Debug *ar) {
	if (!currentL) {
		return nullptr;
	}

	auto L = currentL;

	const int cl = getDebugCurrentLine(ar);
	auto lineSet = manager->GetLineSet();

	if (cl >= 0 && lineSet.find(cl) != lineSet.end()) {
		lua_getinfo(L, "S", ar);
		const auto chunkname = GetFile(ar);
		return FindBreakPoint(chunkname, cl);
	}
	return nullptr;
}